

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_line_strip(rf_vec2 *points,int points_count,rf_color color)

{
  _Bool _Var1;
  ulong uVar2;
  
  if (1 < points_count) {
    _Var1 = rf_gfx_check_buffer_limit(points_count);
    if (_Var1) {
      rf_gfx_draw();
    }
    rf_gfx_begin(RF_LINES);
    rf_gfx_color4ub(color.r,color.g,color.b,color.a);
    for (uVar2 = 0; points_count - 1 != uVar2; uVar2 = uVar2 + 1) {
      rf_gfx_vertex2f(points[uVar2].x,points[uVar2].y);
      rf_gfx_vertex2f(points[uVar2 + 1].x,points[uVar2 + 1].y);
    }
    rf_gfx_end();
    return;
  }
  return;
}

Assistant:

RF_API void rf_draw_line_strip(rf_vec2 *points, int points_count, rf_color color)
{
    if (points_count >= 2)
    {
        if (rf_gfx_check_buffer_limit(points_count)) rf_gfx_draw();

        rf_gfx_begin(RF_LINES);
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        for (rf_int i = 0; i < points_count - 1; i++)
        {
            rf_gfx_vertex2f(points[i].x, points[i].y);
            rf_gfx_vertex2f(points[i + 1].x, points[i + 1].y);
        }
        rf_gfx_end();
    }
}